

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_test.cc
# Opt level: O3

void __thiscall leveldb::Status_MoveConstructor_Test::TestBody(Status_MoveConstructor_Test *this)

{
  size_t sVar1;
  Status SVar2;
  char cVar3;
  char *in_R9;
  char *message;
  Status status2;
  Status status;
  Slice local_78;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_68;
  Status local_60;
  Status local_58;
  string local_50;
  AssertHelper local_30;
  
  local_50._M_dataplus._M_p = "custom NotFound status message";
  local_50._M_string_length = 0x1e;
  message = "";
  local_78.data_ = "";
  local_78.size_ = 0;
  Status::Status(&local_58,kNotFound,(Slice *)&local_50,&local_78);
  SVar2.state_ = local_58.state_;
  local_60.state_ = local_58.state_;
  local_58.state_ = (char *)0x0;
  if (SVar2.state_ == (char *)0x0) {
    local_78.data_ = (char *)((ulong)local_78.data_._1_7_ << 8);
  }
  else {
    local_78.data_ = (char *)CONCAT71(local_78.data_._1_7_,SVar2.state_[4] == '\x01');
    local_78.size_ = 0;
    if (SVar2.state_[4] == '\x01') {
      Status::ToString_abi_cxx11_(&local_50,&local_60);
      testing::internal::CmpHelperEQ<char[41],std::__cxx11::string>
                ((internal *)&local_78,"\"NotFound: custom NotFound status message\"",
                 "status2.ToString()",(char (*) [41])"NotFound: custom NotFound status message",
                 &local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      cVar3 = (char)local_78.data_;
      if ((char)local_78.data_ == '\0') {
        testing::Message::Message((Message *)&local_50);
        if ((undefined8 *)local_78.size_ != (undefined8 *)0x0) {
          message = *(char **)local_78.size_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_68,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/status_test.cc"
                   ,0x1b,message);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)&local_50);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
        if ((long *)local_50._M_dataplus._M_p != (long *)0x0) {
          (**(code **)(*(long *)local_50._M_dataplus._M_p + 8))();
        }
      }
      sVar1 = local_78.size_;
      SVar2.state_ = local_60.state_;
      if ((undefined8 *)local_78.size_ != (undefined8 *)0x0) {
        if (*(undefined8 **)local_78.size_ != (undefined8 *)(local_78.size_ + 0x10)) {
          operator_delete(*(undefined8 **)local_78.size_);
        }
        operator_delete((void *)sVar1);
        SVar2.state_ = local_60.state_;
      }
      goto LAB_001076ca;
    }
  }
  local_78.size_ = 0;
  testing::Message::Message((Message *)&local_68);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            (&local_50,(internal *)&local_78,(AssertionResult *)"status2.IsNotFound()","false",
             "true",in_R9);
  testing::internal::AssertHelper::AssertHelper
            (&local_30,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/status_test.cc"
             ,0x1a,local_50._M_dataplus._M_p);
  testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_68);
  testing::internal::AssertHelper::~AssertHelper(&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_68._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_68._M_head_impl + 8))();
  }
  sVar1 = local_78.size_;
  if ((undefined8 *)local_78.size_ != (undefined8 *)0x0) {
    if (*(undefined8 **)local_78.size_ != (undefined8 *)(local_78.size_ + 0x10)) {
      operator_delete(*(undefined8 **)local_78.size_);
    }
    operator_delete((void *)sVar1);
  }
  cVar3 = '\0';
LAB_001076ca:
  if (SVar2.state_ != (char *)0x0) {
    operator_delete__(SVar2.state_);
  }
  if (local_58.state_ != (char *)0x0) {
    operator_delete__(local_58.state_);
  }
  if (cVar3 != '\0') {
    local_50._M_dataplus._M_p = "custom IOError status message";
    local_50._M_string_length = 0x1d;
    local_78.data_ = "";
    local_78.size_ = 0;
    Status::Status(&local_58,kIOError,(Slice *)&local_50,&local_78);
    if (local_58.state_ != (char *)0x0) {
      operator_delete__(local_58.state_);
    }
  }
  return;
}

Assistant:

int main(int argc, char** argv) {
  testing::InitGoogleTest(&argc, argv);
  return RUN_ALL_TESTS();
}